

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::ConvertToSampledImagePass::GetSampledImageTypeForImage
          (ConvertToSampledImagePass *this,Instruction *image_variable)

{
  IRContext *this_00;
  int iVar1;
  uint32_t uVar2;
  Type *pTVar3;
  undefined4 extraout_var;
  SampledImage sampled_image_type;
  Image image_type_for_sampled_image;
  Type local_a0;
  undefined ***local_78;
  undefined **local_70;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_68;
  undefined4 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long lVar4;
  
  pTVar3 = GetVariableType(this,image_variable);
  uVar2 = 0;
  if (pTVar3 != (Type *)0x0) {
    iVar1 = (*pTVar3->_vptr_Type[0x12])(pTVar3);
    lVar4 = CONCAT44(extraout_var,iVar1);
    uVar2 = 0;
    if (lVar4 != 0) {
      local_70 = &PTR__Type_003e9e18;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(&local_68,
               (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)(lVar4 + 8));
      local_50 = *(undefined4 *)(lVar4 + 0x20);
      local_70 = &PTR__Type_003ec740;
      local_48 = *(undefined8 *)(lVar4 + 0x28);
      uStack_40 = *(undefined8 *)(lVar4 + 0x30);
      local_38 = *(undefined8 *)(lVar4 + 0x38);
      uStack_30 = *(undefined8 *)(lVar4 + 0x40);
      local_a0.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a0.kind_ = kSampledImage;
      local_a0._vptr_Type = (_func_int **)&PTR__Type_003edbc0;
      local_78 = &local_70;
      this_00 = (this->super_Pass).context_;
      if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
        IRContext::BuildTypeManager(this_00);
      }
      uVar2 = analysis::TypeManager::GetTypeInstruction
                        ((this_00->type_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                         _M_head_impl,&local_a0);
      local_a0._vptr_Type = (_func_int **)&PTR__Type_003e9e18;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_a0.decorations_);
      local_70 = &PTR__Type_003e9e18;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_68);
    }
  }
  return uVar2;
}

Assistant:

uint32_t ConvertToSampledImagePass::GetSampledImageTypeForImage(
    Instruction* image_variable) {
  const auto* variable_type = GetVariableType(*image_variable);
  if (variable_type == nullptr) return 0;
  const auto* image_type = variable_type->AsImage();
  if (image_type == nullptr) return 0;

  analysis::Image image_type_for_sampled_image(*image_type);
  analysis::SampledImage sampled_image_type(&image_type_for_sampled_image);
  return context()->get_type_mgr()->GetTypeInstruction(&sampled_image_type);
}